

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcms_config_find_param.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  long in_RSI;
  int in_EDI;
  double dVar4;
  bad_value_cast *e_3;
  uint i;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vs;
  bad_value_cast *e_2;
  bad_value_cast *e_1;
  bad_value_cast *e;
  string path;
  value v;
  ifstream in;
  string *in_stack_fffffffffffffce8;
  value *in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcff;
  istream *in_stack_fffffffffffffd00;
  value *in_stack_fffffffffffffd08;
  allocator local_251;
  string local_250 [40];
  undefined4 local_228;
  long local_218 [65];
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 3) {
    local_10 = in_RSI;
    std::ifstream::ifstream(local_218,*(undefined8 *)(in_RSI + 0x10),8);
    bVar2 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
    if ((bVar2 & 1) == 0) {
      cppcms::json::value::value((value *)0x1147e3);
      bVar3 = cppcms::json::value::load
                        (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                         (bool)in_stack_fffffffffffffcff,(int *)in_stack_fffffffffffffcf0);
      if (bVar3) {
        pcVar1 = *(char **)(local_10 + 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_250,pcVar1,&local_251);
        std::allocator<char>::~allocator((allocator<char> *)&local_251);
        dVar4 = cppcms::json::value::get<double>
                          (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        std::ostream::operator<<((ostream *)&std::cout,dVar4);
        local_4 = 0;
        local_228 = 1;
        std::__cxx11::string::~string(local_250);
      }
      else {
        local_4 = 1;
        local_228 = 1;
      }
      cppcms::json::value::~value((value *)0x114c92);
    }
    else {
      local_4 = 1;
      local_228 = 1;
    }
    std::ifstream::~ifstream(local_218);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc,char **argv)
{
	using namespace cppcms;
	if(argc!=3)
		return 1;
	std::ifstream in(argv[2]);
	if(!in)
		return 1;
	
	json::value v;
	if(!v.load(in,true))
		return 1;
	std::string path=argv[1];
	try {
		std::cout<<v.get<double>(path);
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	try {
		std::cout<<v.get<std::string>(path);
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	try {
		std::cout<< (v.get<bool>(path) ? "true" : "false" );
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	try {
		std::vector<std::string> vs=v.get<std::vector<std::string> >(path);
		std::string sep="";
		for(unsigned i=0;i<vs.size();i++) {
			std::cout<<sep<<vs[i];
			sep=" ";
		}
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	return 1;
}